

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O1

Fraig_Man_t * Fraig_ManCreate(Fraig_Params_t *pParams)

{
  int iVar1;
  int *piVar2;
  Fraig_Man_t *p;
  Fraig_MemFixed_t *pFVar3;
  Fraig_NodeVec_t *pFVar4;
  Fraig_HashTable_t *pFVar5;
  Fraig_Node_t *pFVar6;
  Msat_IntVec_t *pMVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  ABC_INT64_T *local_a8;
  int *local_a0;
  int *local_98;
  int *local_90;
  int *local_88;
  int local_80 [2];
  int local_78 [2];
  int local_70 [2];
  int local_68 [2];
  int local_60 [2];
  int local_58;
  int local_50 [6];
  ABC_INT64_T local_38;
  
  Aig_ManRandom(1);
  if (pParams == (Fraig_Params_t *)0x0) {
    local_88 = local_50 + 2;
    local_50[2] = 0;
    local_90 = local_78;
    local_78[0] = 0;
    local_98 = local_80;
    local_80[0] = 0;
    local_a0 = local_50;
    local_50[0] = 0;
    local_a8 = &local_38;
    local_38 = 0;
    pParams = (Fraig_Params_t *)&local_58;
    local_58 = 0x800;
    piVar9 = local_50 + 5;
    local_50[5] = 0x800;
    local_b0 = local_60;
    local_60[0] = 99;
    local_b8 = local_50 + 4;
    local_50[4] = 0x14;
    piVar2 = local_68;
    local_68[0] = 1;
    local_c0 = local_50 + 3;
    local_50[3] = 1;
    piVar8 = local_70;
    local_70[0] = 1;
    piVar10 = local_50 + 1;
    local_50[1] = 1;
  }
  else {
    local_b0 = &pParams->nBTLimit;
    local_b8 = &pParams->nSeconds;
    piVar2 = &pParams->fFuncRed;
    local_c0 = &pParams->fFeedBack;
    piVar8 = &pParams->fDist1Pats;
    local_88 = &pParams->fDoSparse;
    local_90 = &pParams->fChoicing;
    piVar10 = &pParams->fTryProve;
    local_98 = &pParams->fVerbose;
    local_a0 = &pParams->fVerboseP;
    local_a8 = &pParams->nInspLimit;
    piVar9 = &pParams->nPatsDyna;
  }
  if (pParams->nPatsRand < 0x80) {
    pParams->nPatsRand = 0x80;
  }
  if (0x8000 < pParams->nPatsRand) {
    pParams->nPatsRand = 0x8000;
  }
  if (*piVar9 < 0x80) {
    *piVar9 = 0x80;
  }
  if (0x8000 < *piVar9) {
    *piVar9 = 0x8000;
  }
  iVar1 = *piVar2;
  if (iVar1 == 0) {
    *piVar9 = 0x80;
    pParams->nPatsRand = 0x80;
  }
  p = (Fraig_Man_t *)malloc(0x1d0);
  memset(p,0,0x1d0);
  p->nWordsRand = ((pParams->nPatsRand >> 5) + 1) - (uint)((pParams->nPatsRand & 0x1fU) == 0);
  p->nWordsDyna = ((*piVar9 >> 5) + 1) - (uint)((*piVar9 & 0x1fU) == 0);
  p->nBTLimit = *local_b0;
  p->nSeconds = *local_b8;
  p->fFuncRed = iVar1;
  p->fFeedBack = *local_c0;
  p->fDist1Pats = *piVar8;
  p->fDoSparse = *local_88;
  p->fChoicing = *local_90;
  p->fTryProve = *piVar10;
  p->fVerbose = *local_98;
  p->fVerboseP = *local_a0;
  p->nInspLimit = *local_a8;
  pFVar3 = Fraig_MemFixedStart(0xa0);
  p->mmNodes = pFVar3;
  pFVar3 = Fraig_MemFixedStart((p->nWordsDyna + p->nWordsRand) * 4);
  p->mmSims = pFVar3;
  pFVar4 = Fraig_NodeVecAlloc(1000);
  p->vInputs = pFVar4;
  pFVar4 = Fraig_NodeVecAlloc(1000);
  p->vOutputs = pFVar4;
  pFVar4 = Fraig_NodeVecAlloc(1000);
  p->vNodes = pFVar4;
  pFVar5 = Fraig_HashTableCreate(1000);
  p->pTableS = pFVar5;
  pFVar5 = Fraig_HashTableCreate(1000);
  p->pTableF = pFVar5;
  pFVar5 = Fraig_HashTableCreate(1000);
  p->pTableF0 = pFVar5;
  pFVar6 = Fraig_NodeCreateConst(p);
  p->pConst1 = pFVar6;
  Fraig_FeedBackInit(p);
  pMVar7 = Msat_IntVecAlloc(10);
  p->vProj = pMVar7;
  p->nTravIds = 1;
  p->nTravIds2 = 1;
  return p;
}

Assistant:

Fraig_Man_t * Fraig_ManCreate( Fraig_Params_t * pParams )
{
    Fraig_Params_t Params;
    Fraig_Man_t * p;

    // set the random seed for simulation
//    srand( 0xFEEDDEAF );
//    srand( 0xDEADCAFE );
    Aig_ManRandom( 1 );

    // set parameters for equivalence checking
    if ( pParams == NULL )
        Fraig_ParamsSetDefault( pParams = &Params );
    // adjust the amount of simulation info
    if ( pParams->nPatsRand < 128 )
        pParams->nPatsRand = 128;
    if ( pParams->nPatsRand > 32768 )
        pParams->nPatsRand = 32768;
    if ( pParams->nPatsDyna < 128 )
        pParams->nPatsDyna = 128;
    if ( pParams->nPatsDyna > 32768 )
        pParams->nPatsDyna = 32768;
    // if reduction is not performed, allocate minimum simulation info
    if ( !pParams->fFuncRed )
        pParams->nPatsRand = pParams->nPatsDyna = 128;

    // start the manager
    p = ABC_ALLOC( Fraig_Man_t, 1 );
    memset( p, 0, sizeof(Fraig_Man_t) );

    // set the default parameters
    p->nWordsRand = FRAIG_NUM_WORDS( pParams->nPatsRand );  // the number of words of random simulation info
    p->nWordsDyna = FRAIG_NUM_WORDS( pParams->nPatsDyna );  // the number of patterns for dynamic simulation info
    p->nBTLimit   = pParams->nBTLimit;    // -1 means infinite backtrack limit
    p->nSeconds   = pParams->nSeconds;    // the timeout for the final miter
    p->fFuncRed   = pParams->fFuncRed;    // enables functional reduction (otherwise, only one-level hashing is performed)
    p->fFeedBack  = pParams->fFeedBack;   // enables solver feedback (the use of counter-examples in simulation)
    p->fDist1Pats = pParams->fDist1Pats;  // enables solver feedback (the use of counter-examples in simulation)
    p->fDoSparse  = pParams->fDoSparse;   // performs equivalence checking for sparse functions (whose sim-info is 0)
    p->fChoicing  = pParams->fChoicing;   // disable accumulation of structural choices (keeps only the first choice)
    p->fTryProve  = pParams->fTryProve;   // disable accumulation of structural choices (keeps only the first choice)
    p->fVerbose   = pParams->fVerbose;    // disable verbose output
    p->fVerboseP  = pParams->fVerboseP;   // disable verbose output
    p->nInspLimit = pParams->nInspLimit;  // the limit on the number of inspections

    // start memory managers
    p->mmNodes    = Fraig_MemFixedStart( sizeof(Fraig_Node_t) );
    p->mmSims     = Fraig_MemFixedStart( sizeof(unsigned) * (p->nWordsRand + p->nWordsDyna) );
    // allocate node arrays
    p->vInputs    = Fraig_NodeVecAlloc( 1000 );    // the array of primary inputs
    p->vOutputs   = Fraig_NodeVecAlloc( 1000 );    // the array of primary outputs
    p->vNodes     = Fraig_NodeVecAlloc( 1000 );    // the array of internal nodes
    // start the tables
    p->pTableS    = Fraig_HashTableCreate( 1000 ); // hashing by structure
    p->pTableF    = Fraig_HashTableCreate( 1000 ); // hashing by function
    p->pTableF0   = Fraig_HashTableCreate( 1000 ); // hashing by function (for sparse functions)
    // create the constant node
    p->pConst1    = Fraig_NodeCreateConst( p );
    // initialize SAT solver feedback data structures
    Fraig_FeedBackInit( p );
    // initialize other variables
    p->vProj      = Msat_IntVecAlloc( 10 ); 
    p->nTravIds   = 1;
    p->nTravIds2  = 1;
    return p;
}